

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O1

void __thiscall TextFile::bufPut(TextFile *this,char c)

{
  pointer pcVar1;
  size_t sVar2;
  
  if (this->mode == Write) {
    if (0xfff < this->bufPos) {
      std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                           field_0x10,(long)(this->buf)._M_dataplus._M_p);
      this->bufPos = 0;
    }
    pcVar1 = (this->buf)._M_dataplus._M_p;
    sVar2 = this->bufPos;
    this->bufPos = sVar2 + 1;
    pcVar1[sVar2] = c;
    return;
  }
  __assert_fail("mode == Write",
                "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Util/FileClasses.cpp"
                ,0x3a3,"void TextFile::bufPut(const char)");
}

Assistant:

void TextFile::bufPut(const char c)
{
	assert(mode == Write);

	if (bufPos >= TEXTFILE_BUF_MAX_SIZE)
		bufDrainWrite();

	buf[bufPos++] = c;
}